

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O1

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  uint uVar2;
  char *p2;
  int p1;
  char **ppcVar3;
  char *__path;
  byte bVar4;
  
  progname = *argv;
  if (argv[1] == (char *)0x0) {
    strerr_die(1,"usage: ",progname," u|d|o|p|c|h|a|i|q|1|2|t|k|x|e service ...","\n",(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  bVar4 = *argv[1];
  uVar2 = bVar4 - 0x61;
  p2 = (char *)(ulong)uVar2;
  if (uVar2 < 0x18) {
    if ((0x99c58dU >> (uVar2 & 0x1f) & 1) != 0) goto LAB_001023a2;
    if (uVar2 == 4) {
      bVar4 = 0x78;
      goto LAB_001023a2;
    }
  }
  if (1 < bVar4 - 0x31) {
    p2 = " u|d|o|p|c|h|a|i|q|1|2|t|k|x|e service ...";
    strerr_die(1,"usage: ",progname," u|d|o|p|c|h|a|i|q|1|2|t|k|x|e service ...","\n",(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
LAB_001023a2:
  if (argv[2] == (char *)0x0) {
    p2 = " u|d|o|p|c|h|a|i|q|1|2|t|k|x|e service ...";
    strerr_die(1,"usage: ",progname," u|d|o|p|c|h|a|i|q|1|2|t|k|x|e service ...","\n",(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  __fd = open_read(".");
  if (__fd == -1) {
    rc = 100;
    p2 = ": ";
    strerr_die(0x6f,"runsvctrl: fatal: ","unable to open current directory",": ",(char *)0x0,
               (char *)0x0,(char *)0x0,&strerr_sys);
  }
  __path = argv[2];
  if (__path != (char *)0x0) {
    ppcVar3 = argv + 3;
    do {
      iVar1 = chdir(__path);
      if (iVar1 == -1) {
        rc = rc + 1;
        p2 = "unable to change directory";
        strerr_warn("runsvctrl: warning: ",ppcVar3[-1],": ","unable to change directory",": ",
                    (char *)0x0,&strerr_sys);
      }
      else {
        ctrl((EVP_PKEY_CTX *)ppcVar3[-1],(int)(char)bVar4,p1,p2);
        iVar1 = fchdir(__fd);
        if (iVar1 == -1) {
          rc = 100;
          p2 = ": ";
          strerr_die(0x6f,"runsvctrl: fatal: ","unable to change directory",": ",(char *)0x0,
                     (char *)0x0,(char *)0x0,&strerr_sys);
        }
      }
      __path = *ppcVar3;
      ppcVar3 = ppcVar3 + 1;
    } while (__path != (char *)0x0);
  }
  if (100 < rc) {
    rc = 100;
  }
  _exit(rc);
}

Assistant:

int main(int argc, char **argv) {
  char **dir;
  int curdir;
  char c;

  progname =*argv++;

  if (! argv || ! *argv) usage();

  switch ((c =**argv)) {
  case 'e': c ='x';
  case 'u': case 'd': case 'o': case 'x': case 'p': case 'c': case 'h':
  case 'a': case 'i': case 't': case 'k': case 'q': case '1': case '2':
    break;
  default:
    usage();
  }
  dir =++argv;
  if (! dir || ! *dir) usage();

  if ((curdir =open_read(".")) == -1) {
    rc =100;
    fatal("unable to open current directory");
  }
  for (; dir && *dir; dir++) {
    if (chdir(*dir) == -1) {
      warn(*dir, "unable to change directory");
      continue;
    }
    ctrl(*dir, c);
    if (fchdir(curdir) == -1) {
      rc =100;
      fatal("unable to change directory");
    }
  }
  if (rc > 100) rc =100;
  _exit(rc);
}